

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

bool __thiscall glslang::TInputScanner::consumeComment(TInputScanner *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = peek(this);
  if (iVar1 != 0x2f) {
    return false;
  }
  get(this);
  iVar1 = peek(this);
  if (iVar1 == 0x2a) {
    get(this);
    do {
      iVar1 = get(this);
      while (iVar1 == 0x2a) {
        iVar1 = get(this);
        if (iVar1 == 0x2f) {
          return true;
        }
      }
    } while (iVar1 != -1);
    return true;
  }
  if (iVar1 == 0x2f) {
    do {
      get(this);
      do {
        while (iVar1 = get(this), iVar1 != 0x5c) {
          if ((iVar1 + 1U < 0xf) && ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) != 0)) goto LAB_0042c713;
        }
        iVar1 = get(this);
      } while ((iVar1 != 0xd) || (iVar1 = peek(this), iVar1 != 10));
    } while( true );
  }
  bVar2 = false;
LAB_0042c75b:
  unget(this);
  return bVar2;
LAB_0042c713:
  while ((iVar1 == 10 || (iVar1 == 0xd))) {
    iVar1 = get(this);
  }
  bVar2 = true;
  if (iVar1 == -1) {
    return true;
  }
  goto LAB_0042c75b;
}

Assistant:

bool TInputScanner::consumeComment()
{
    if (peek() != '/')
        return false;

    get();  // consume the '/'
    int c = peek();
    if (c == '/') {

        // a '//' style comment
        get();  // consume the second '/'
        c = get();
        do {
            while (c != EndOfInput && c != '\\' && c != '\r' && c != '\n')
                c = get();

            if (c == EndOfInput || c == '\r' || c == '\n') {
                while (c == '\r' || c == '\n')
                    c = get();

                // we reached the end of the comment
                break;
            } else {
                // it's a '\', so we need to keep going, after skipping what's escaped

                // read the skipped character
                c = get();

                // if it's a two-character newline, skip both characters
                if (c == '\r' && peek() == '\n')
                    get();
                c = get();
            }
        } while (true);

        // put back the last non-comment character
        if (c != EndOfInput)
            unget();

        return true;
    } else if (c == '*') {

        // a '/*' style comment
        get();  // consume the '*'
        c = get();
        do {
            while (c != EndOfInput && c != '*')
                c = get();
            if (c == '*') {
                c = get();
                if (c == '/')
                    break;  // end of comment
                // not end of comment
            } else // end of input
                break;
        } while (true);

        return true;
    } else {
        // it's not a comment, put the '/' back
        unget();

        return false;
    }
}